

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_call_c_function(JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,
                          int flags)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  JSRuntime *pJVar4;
  JSContext *ctx_00;
  code *pcVar5;
  int64_t iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int64_t *piVar10;
  JSValueUnion JVar11;
  JSValue *__dest;
  JSValueUnion JVar12;
  uint uVar13;
  int64_t iVar14;
  anon_union_8_2_94730072 u;
  double dVar15;
  JSValue JVar16;
  JSValue JVar17;
  undefined8 uStack_c0;
  undefined1 auStack_b8 [16];
  JSStackFrame sf_s;
  double d2;
  int local_38;
  undefined4 uStack_34;
  int done;
  
  iVar14 = this_obj.tag;
  JVar11 = this_obj.u;
  JVar12 = func_obj.u;
  __dest = (JSValue *)auStack_b8;
  pJVar4 = ctx->rt;
  bVar1 = *(byte *)((long)JVar12.ptr + 0x40);
  uVar13 = (uint)bVar1;
  if (&stack0xfffffffffffffff8 + (ulong)bVar1 * -0x10 < (undefined1 *)pJVar4->stack_limit) {
    JVar11.float64 = 0.0;
    uStack_c0 = 0x115d9b;
    JS_ThrowInternalError(ctx,"stack overflow");
    iVar14 = 6;
    goto LAB_00116083;
  }
  bVar2 = *(byte *)((long)JVar12.ptr + 0x41);
  auStack_b8._8_8_ = pJVar4->current_stack_frame;
  pJVar4->current_stack_frame = (JSStackFrame *)(auStack_b8 + 8);
  ctx_00 = *(JSContext **)((long)JVar12.ptr + 0x30);
  sf_s.cur_pc._4_4_ = 0;
  sf_s.prev_frame = (JSStackFrame *)JVar12.ptr;
  sf_s.cur_func.u = (JSValueUnion)func_obj.tag;
  sf_s.cur_pc._0_4_ = argc;
  if (argc < (int)(uint)bVar1) {
    __dest = (JSValue *)(auStack_b8 + -(ulong)(uVar13 * 0x10));
    if (0 < argc) {
      *(undefined8 *)(auStack_b8 + -(ulong)(uVar13 * 0x10) + -8) = 0x1160cc;
      memcpy(__dest,argv,(ulong)(uint)argc << 4);
    }
    lVar9 = (ulong)uVar13 - (long)argc;
    piVar10 = &__dest[argc].tag;
    do {
      (((JSValue *)(piVar10 + -1))->u).int32 = 0;
      *piVar10 = 3;
      piVar10 = piVar10 + 2;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    sf_s.cur_pc._0_4_ = uVar13;
    argv = __dest;
  }
  sf_s.cur_func.tag = (int64_t)argv;
  if (0xc < bVar2) {
    __dest[-1].tag = (int64_t)js_c_function_data_call;
    abort();
  }
  uVar8 = (ulong)JVar11.ptr & 0xffffffff00000000;
  pcVar5 = *(code **)((long)JVar12.ptr + 0x38);
  switch(bVar2) {
  case 0:
    goto switchD_00115e2c_caseD_0;
  case 1:
    goto switchD_00115e2c_caseD_1;
  default:
    if ((flags & 1U) == 0) {
      if (bVar2 == 2) {
LAB_00115e6f:
        __dest[-1].tag = 0x115e83;
        JS_ThrowTypeError(ctx_00,"must be called with new");
        goto LAB_00115e89;
      }
      iVar14 = 3;
      JVar11.float64 = 0.0;
    }
    goto switchD_00115e2c_caseD_0;
  case 3:
  case 5:
    if ((flags & 1U) == 0) {
      if (bVar2 == 3) goto LAB_00115e6f;
      iVar14 = 3;
      JVar11.float64 = 0.0;
    }
    goto switchD_00115e2c_caseD_1;
  case 6:
    JVar16 = *argv;
    __dest[-1].tag = 0x115fc5;
    iVar7 = JS_ToFloat64(ctx_00,(double *)&local_38,JVar16);
    if (iVar7 != 0) {
LAB_00115e89:
      JVar16 = (JSValue)(ZEXT816(6) << 0x40);
      break;
    }
    __dest[-1].tag = 0x115fd4;
    dVar15 = (double)(*pcVar5)(CONCAT44(uStack_34,local_38));
LAB_00115ff7:
    uVar8 = (ulong)dVar15 & 0xffffffff;
    JVar11.float64 = dVar15 & 0xffffffff00000000;
    if (dVar15 == (double)(int)dVar15) {
      uVar8 = (ulong)(uint)(int)dVar15;
      JVar11.float64 = 0.0;
    }
    JVar12.float64 = 3.45845952088873e-323;
    if (dVar15 == (double)(int)dVar15) {
      JVar12.float64 = 0.0;
    }
    JVar16.tag = (int64_t)JVar12.ptr;
    JVar16.u.float64 = uVar8 | JVar11.float64;
    goto LAB_0011606c;
  case 7:
    JVar16 = *argv;
    __dest[-1].tag = 0x115f51;
    iVar7 = JS_ToFloat64(ctx_00,(double *)&local_38,JVar16);
    if (iVar7 != 0) goto LAB_00115e89;
    JVar16 = argv[1];
    __dest[-1].tag = 0x115f75;
    iVar7 = JS_ToFloat64(ctx_00,(double *)&sf_s.cur_sp,JVar16);
    if (iVar7 == 0) {
      __dest[-1].tag = 0x115f94;
      dVar15 = (double)(*pcVar5)(CONCAT44(uStack_34,local_38),sf_s.cur_sp._0_4_);
      goto LAB_00115ff7;
    }
    JVar16 = (JSValue)(ZEXT816(6) << 0x40);
    JVar11.float64 = 0.0;
    goto LAB_0011606c;
  case 8:
    __dest[-1].tag = 0x116034;
    JVar16 = (JSValue)(*pcVar5)(ctx_00,JVar11.float64,iVar14);
    break;
  case 9:
    dVar15 = (argv->u).float64;
    iVar6 = argv->tag;
    __dest[-1].tag = 0x115f30;
    JVar16 = (JSValue)(*pcVar5)(ctx_00,JVar11.float64,iVar14,dVar15,iVar6);
    break;
  case 10:
    sVar3 = *(short *)((long)JVar12.ptr + 0x42);
    __dest[-1].tag = 0x116026;
    JVar16 = (JSValue)(*pcVar5)(ctx_00,JVar11.float64,iVar14,(int)sVar3);
    break;
  case 0xb:
    sVar3 = *(short *)((long)JVar12.ptr + 0x42);
    dVar15 = (argv->u).float64;
    iVar6 = argv->tag;
    __dest[-1].tag = 0x115eaa;
    JVar16 = (JSValue)(*pcVar5)(ctx_00,JVar11.float64,iVar14,dVar15,iVar6,(int)sVar3);
    break;
  case 0xc:
    JVar12._0_4_ = (uint)*(short *)((long)JVar12.ptr + 0x42);
    JVar12._4_4_ = 0;
    __dest[-1].u = JVar12;
    __dest[-2].tag = 0x115ed7;
    JVar16 = (JSValue)(*pcVar5)(ctx_00,JVar11.float64,iVar14,argc,argv,&local_38);
    if (local_38 != 2 && (int)JVar16.tag != 6) {
      __dest[-1].tag = 0x115f05;
      JVar16 = js_create_iterator_result(ctx_00,JVar16,local_38);
    }
    JVar11 = JVar16.u;
    goto LAB_0011606c;
  }
LAB_00116062:
  JVar11 = JVar16.u;
LAB_0011606c:
  iVar14 = JVar16.tag;
  pJVar4->current_stack_frame = (JSStackFrame *)auStack_b8._8_8_;
  JVar11.ptr = (void *)((ulong)JVar16.u.ptr & 0xffffffff | (ulong)JVar11.ptr & 0xffffffff00000000);
LAB_00116083:
  JVar17.tag = iVar14;
  JVar17.u.float64 = JVar11.float64;
  return JVar17;
switchD_00115e2c_caseD_1:
  sVar3 = *(short *)((long)JVar12.ptr + 0x42);
  __dest[-1].tag = 0x11605c;
  JVar16 = (JSValue)(*pcVar5)(ctx_00,(ulong)JVar11.ptr & 0xffffffff | uVar8,iVar14,argc,argv,
                              (int)sVar3);
  goto LAB_00116062;
switchD_00115e2c_caseD_0:
  __dest[-1].tag = 0x115e57;
  JVar16 = (JSValue)(*pcVar5)(ctx_00,(ulong)JVar11.ptr & 0xffffffff | uVar8,iVar14,argc,argv);
  goto LAB_00116062;
}

Assistant:

static JSValue js_call_c_function(JSContext *ctx, JSValueConst func_obj,
                                  JSValueConst this_obj,
                                  int argc, JSValueConst *argv, int flags)
{
    JSRuntime *rt = ctx->rt;
    JSCFunctionType func;
    JSObject *p;
    JSStackFrame sf_s, *sf = &sf_s, *prev_sf;
    JSValue ret_val;
    JSValueConst *arg_buf;
    int arg_count, i;
    JSCFunctionEnum cproto;

    p = JS_VALUE_GET_OBJ(func_obj);
    cproto = p->u.cfunc.cproto;
    arg_count = p->u.cfunc.length;

    /* better to always check stack overflow */
    if (js_check_stack_overflow(rt, sizeof(arg_buf[0]) * arg_count))
        return JS_ThrowStackOverflow(ctx);

    prev_sf = rt->current_stack_frame;
    sf->prev_frame = prev_sf;
    rt->current_stack_frame = sf;
    ctx = p->u.cfunc.realm; /* change the current realm */
    
#ifdef CONFIG_BIGNUM
    /* we only propagate the bignum mode as some runtime functions
       test it */
    if (prev_sf)
        sf->js_mode = prev_sf->js_mode & JS_MODE_MATH;
    else
        sf->js_mode = 0;
#else
    sf->js_mode = 0;
#endif
    sf->cur_func = (JSValue)func_obj;
    sf->arg_count = argc;
    arg_buf = argv;

    if (unlikely(argc < arg_count)) {
        /* ensure that at least argc_count arguments are readable */
        arg_buf = alloca(sizeof(arg_buf[0]) * arg_count);
        for(i = 0; i < argc; i++)
            arg_buf[i] = argv[i];
        for(i = argc; i < arg_count; i++)
            arg_buf[i] = JS_UNDEFINED;
        sf->arg_count = arg_count;
    }
    sf->arg_buf = (JSValue*)arg_buf;

    func = p->u.cfunc.c_function;
    switch(cproto) {
    case JS_CFUNC_constructor:
    case JS_CFUNC_constructor_or_func:
        if (!(flags & JS_CALL_FLAG_CONSTRUCTOR)) {
            if (cproto == JS_CFUNC_constructor) {
            not_a_constructor:
                ret_val = JS_ThrowTypeError(ctx, "must be called with new");
                break;
            } else {
                this_obj = JS_UNDEFINED;
            }
        }
        /* here this_obj is new_target */
        /* fall thru */
    case JS_CFUNC_generic:
        ret_val = func.generic(ctx, this_obj, argc, arg_buf);
        break;
    case JS_CFUNC_constructor_magic:
    case JS_CFUNC_constructor_or_func_magic:
        if (!(flags & JS_CALL_FLAG_CONSTRUCTOR)) {
            if (cproto == JS_CFUNC_constructor_magic) {
                goto not_a_constructor;
            } else {
                this_obj = JS_UNDEFINED;
            }
        }
        /* fall thru */
    case JS_CFUNC_generic_magic:
        ret_val = func.generic_magic(ctx, this_obj, argc, arg_buf,
                                     p->u.cfunc.magic);
        break;
    case JS_CFUNC_getter:
        ret_val = func.getter(ctx, this_obj);
        break;
    case JS_CFUNC_setter:
        ret_val = func.setter(ctx, this_obj, arg_buf[0]);
        break;
    case JS_CFUNC_getter_magic:
        ret_val = func.getter_magic(ctx, this_obj, p->u.cfunc.magic);
        break;
    case JS_CFUNC_setter_magic:
        ret_val = func.setter_magic(ctx, this_obj, arg_buf[0], p->u.cfunc.magic);
        break;
    case JS_CFUNC_f_f:
        {
            double d1;

            if (unlikely(JS_ToFloat64(ctx, &d1, arg_buf[0]))) {
                ret_val = JS_EXCEPTION;
                break;
            }
            ret_val = JS_NewFloat64(ctx, func.f_f(d1));
        }
        break;
    case JS_CFUNC_f_f_f:
        {
            double d1, d2;

            if (unlikely(JS_ToFloat64(ctx, &d1, arg_buf[0]))) {
                ret_val = JS_EXCEPTION;
                break;
            }
            if (unlikely(JS_ToFloat64(ctx, &d2, arg_buf[1]))) {
                ret_val = JS_EXCEPTION;
                break;
            }
            ret_val = JS_NewFloat64(ctx, func.f_f_f(d1, d2));
        }
        break;
    case JS_CFUNC_iterator_next:
        {
            int done;
            ret_val = func.iterator_next(ctx, this_obj, argc, arg_buf,
                                         &done, p->u.cfunc.magic);
            if (!JS_IsException(ret_val) && done != 2) {
                ret_val = js_create_iterator_result(ctx, ret_val, done);
            }
        }
        break;
    default:
        abort();
    }

    rt->current_stack_frame = sf->prev_frame;
    return ret_val;
}